

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

NLHeader * MakeTestHeader(void)

{
  Kind KVar1;
  NLHeader *in_RDI;
  long lVar2;
  
  lVar2 = 0;
  memset(&(in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_vars,0,0x90);
  (in_RDI->super_NLInfo).super_NLInfo_C.prob_name = "nl_instance";
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[3] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[4] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[5] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[6] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[7] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[8] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[0] = 1;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[1] = 1;
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_options[2] = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.format = 0;
  (in_RDI->super_NLInfo).super_NLInfo_C.num_ampl_options = 9;
  do {
    *(long *)((long)(in_RDI->super_NLInfo).super_NLInfo_C.ampl_options + lVar2 * 2) =
         (long)*(int *)((long)&DAT_002287d0 + lVar2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x24);
  (in_RDI->super_NLInfo).super_NLInfo_C.ampl_vbtol = (double)&DAT_3ff3ae147ae147ae;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_vars = 0x1d;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons = 0x2f;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_objs = 0x25;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_ranges = 0x29;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns = 0x2b;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons = 0x1f;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons = 0x35;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs = 0x3b;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds = 0x43;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds = 0x3d;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_dbl_ineqs = 0x47;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_vars_with_nz_lb = 0x49;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_net_cons = 0x4f;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_cons = 0x53;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons = 0x59;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs = 0x61;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both = 0x65;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_vars = 0x67;
  KVar1 = mp::arith::GetKind();
  (in_RDI->super_NLInfo).super_NLInfo_C.arith_kind = KVar1;
  (in_RDI->super_NLInfo).super_NLInfo_C.flags = 0x6d;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs = 0x6b;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars = 0x71;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars = 0x7f;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both = 0x83;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons = 0x89;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs = 0x8b;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_con_nonzeros = 0x95;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_obj_nonzeros = 0x97;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.max_con_name_len = 0x9d;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.max_var_name_len = 0xa3;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both = 0xa7;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons = 0xad;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs = 0xb3;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons = 0xb5;
  (in_RDI->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs = 0xbf;
  return in_RDI;
}

Assistant:

mp::NLHeader MakeTestHeader() {
  mp::NLHeader h = mp::NLHeader();
  h.format = mp::NLHeader::TEXT;
  h.num_ampl_options = 9;
  int options[] = {2, 3, 5, 7, 11, 13, 17, 19, 23};
  for (int i = 0; i < h.num_ampl_options; ++i)
    h.ampl_options[i] = options[i];
  h.ampl_vbtol = 1.23;

  h.num_vars = 29;
  h.num_algebraic_cons = 47;
  h.num_objs = 37;
  h.num_ranges = 41;
  h.num_eqns = 43;
  h.num_logical_cons = 31;

  h.num_nl_cons = 53;
  h.num_nl_objs = 59;
  h.num_compl_conds = 67;
  h.num_nl_compl_conds = 61;
  h.num_compl_dbl_ineqs = 71;
  h.num_compl_vars_with_nz_lb = 73;

  h.num_nl_net_cons = 79;
  h.num_linear_net_cons = 83;

  h.num_nl_vars_in_cons = 89;
  h.num_nl_vars_in_objs = 97;
  h.num_nl_vars_in_both = 101;

  h.num_linear_net_vars = 103;
  h.num_funcs = 107;
  h.arith_kind = (NLArithKind)mp::arith::GetKind();
  h.flags = 109;

  h.num_linear_binary_vars = 113;
  h.num_linear_integer_vars = 127;
  h.num_nl_integer_vars_in_both = 131;
  h.num_nl_integer_vars_in_cons = 137;
  h.num_nl_integer_vars_in_objs = 139;

  h.num_con_nonzeros = 149;
  h.num_obj_nonzeros = 151;

  h.max_con_name_len = 157;
  h.max_var_name_len = 163;

  h.num_common_exprs_in_both = 167;
  h.num_common_exprs_in_cons = 173;
  h.num_common_exprs_in_objs = 179;
  h.num_common_exprs_in_single_cons = 181;
  h.num_common_exprs_in_single_objs = 191;
  return h;
}